

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool google::protobuf::internal::cpp::IsGroupLike(FieldDescriptor *field)

{
  byte bVar1;
  string *psVar2;
  pointer pcVar3;
  size_t __n;
  long *plVar4;
  int iVar5;
  Descriptor *pDVar6;
  undefined8 extraout_RAX;
  long lVar7;
  bool bVar8;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  if (field->type_ == '\n') {
    psVar2 = field->all_names_;
    pDVar6 = FieldDescriptor::message_type(field);
    pcVar3 = (pDVar6->all_names_->_M_dataplus)._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,pcVar3,pcVar3 + pDVar6->all_names_->_M_string_length);
    absl::lts_20240722::AsciiStrToLower((string *)&local_48);
    plVar4 = local_48;
    __n = psVar2->_M_string_length;
    if (__n == local_40) {
      if (__n == 0) {
        bVar8 = false;
      }
      else {
        iVar5 = bcmp((psVar2->_M_dataplus)._M_p,local_48,__n);
        bVar8 = iVar5 != 0;
      }
    }
    else {
      bVar8 = true;
    }
    if (plVar4 != local_38) {
      operator_delete(plVar4,local_38[0] + 1);
    }
    if ((!bVar8) && (pDVar6 = FieldDescriptor::message_type(field), pDVar6->file_ == field->file_))
    {
      bVar1 = field->field_0x1;
      pDVar6 = FieldDescriptor::message_type(field);
      lVar7 = 0x20;
      if (((bVar1 & 8) != 0) && (lVar7 = 0x28, (field->field_0x1 & 8) == 0)) {
        IsGroupLike((cpp *)&local_48);
        if (local_48 != local_38) {
          operator_delete(local_48,local_38[0] + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      return pDVar6->containing_type_ == *(Descriptor **)(&field->super_SymbolBase + lVar7);
    }
  }
  return false;
}

Assistant:

bool IsGroupLike(const FieldDescriptor& field) {
  // Groups are always tag-delimited, currently specified by a TYPE_GROUP type.
  if (field.type() != FieldDescriptor::TYPE_GROUP) return false;
  // Group fields always are always the lowercase type name.
  if (field.name() != absl::AsciiStrToLower(field.message_type()->name())) {
    return false;
  }

  if (field.message_type()->file() != field.file()) return false;

  // Group messages are always defined in the same scope as the field.  File
  // level extensions will compare NULL == NULL here, which is why the file
  // comparison above is necessary to ensure both come from the same file.
  return field.is_extension() ? field.message_type()->containing_type() ==
                                    field.extension_scope()
                              : field.message_type()->containing_type() ==
                                    field.containing_type();
}